

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaTargetGenerator::AddIncludeFlags
          (cmNinjaTargetGenerator *this,string *languageFlags,string *language)

{
  cmGeneratorTarget *pcVar1;
  cmLocalNinjaGenerator *pcVar2;
  pointer pbVar3;
  bool bVar4;
  string *psVar5;
  cmGlobalNinjaGenerator *this_00;
  char local_7a [2];
  char *local_78;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  undefined1 local_68 [8];
  string includeFlags;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string *language_local;
  string *languageFlags_local;
  cmNinjaTargetGenerator *this_local;
  
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = language;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_38);
  pbVar3 = includes.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar2 = this->LocalGenerator;
  psVar5 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_(&this->super_cmCommonTargetGenerator);
  cmLocalGenerator::GetIncludeDirectories
            ((cmLocalGenerator *)pcVar2,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_38,pcVar1,pbVar3,psVar5,true);
  pbVar3 = includes.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar2 = this->LocalGenerator;
  bVar4 = std::operator==(includes.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,"RC");
  psVar5 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_(&this->super_cmCommonTargetGenerator);
  cmLocalGenerator::GetIncludeFlags
            ((string *)local_68,(cmLocalGenerator *)pcVar2,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_38,pcVar1,pbVar3,bVar4,false,psVar5);
  this_00 = GetGlobalGenerator(this);
  bVar4 = cmGlobalNinjaGenerator::IsGCCOnWindows(this_00);
  if (bVar4) {
    local_70._M_current = (char *)std::__cxx11::string::begin();
    local_78 = (char *)std::__cxx11::string::end();
    local_7a[1] = 0x5c;
    local_7a[0] = '/';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (local_70,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )local_78,local_7a + 1,local_7a);
  }
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    _vptr_cmLocalGenerator[6])(this->LocalGenerator,languageFlags,local_68);
  std::__cxx11::string::~string((string *)local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  return;
}

Assistant:

void cmNinjaTargetGenerator::AddIncludeFlags(std::string& languageFlags,
                                             std::string const& language)
{
  std::vector<std::string> includes;
  this->LocalGenerator->GetIncludeDirectories(includes, this->GeneratorTarget,
                                              language, this->GetConfigName());
  // Add include directory flags.
  std::string includeFlags = this->LocalGenerator->GetIncludeFlags(
    includes, this->GeneratorTarget, language,
    language == "RC", // full include paths for RC needed by cmcldeps
    false, this->GetConfigName());
  if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
    std::replace(includeFlags.begin(), includeFlags.end(), '\\', '/');
  }

  this->LocalGenerator->AppendFlags(languageFlags, includeFlags);
}